

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

bool __thiscall cmCTestGIT::UpdateByFetchAndReset(cmCTestGIT *this)

{
  undefined **ppuVar1;
  pointer pcVar2;
  cmCTest *pcVar3;
  bool bVar4;
  long *plVar5;
  ostream *poVar6;
  long lVar7;
  long *plVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_reset;
  string sha1;
  OutputLogger reset_err;
  string git;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_fetch;
  string opts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  OutputLogger fetch_out;
  OutputLogger fetch_err;
  OutputLogger reset_out;
  string local_3d8;
  undefined1 *local_3b8;
  long local_3b0;
  undefined1 local_3a8;
  undefined7 uStack_3a7;
  OutputLogger local_398;
  value_type local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  cmCTestGIT *local_318;
  string local_310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f0;
  undefined1 local_2d8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  string local_298;
  OutputLogger local_278;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  char *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  long *local_1d8 [2];
  long local_1c8 [51];
  
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_358,pcVar2,
             pcVar2 + (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_string_length
            );
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_338,&local_358);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[6]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_338,
             (char (*) [6])"fetch");
  pcVar3 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  ppuVar1 = (undefined **)(local_238 + 0x10);
  local_238._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"UpdateOptions","");
  cmCTest::GetCTestConfiguration(&local_310,pcVar3,(string *)local_238);
  if ((undefined **)local_238._0_8_ != ppuVar1) {
    operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
  }
  if (local_310._M_string_length == 0) {
    pcVar3 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    local_2d8._0_8_ = local_2d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"GITUpdateOptions","");
    cmCTest::GetCTestConfiguration((string *)local_238,pcVar3,(string *)local_2d8);
    std::__cxx11::string::operator=((string *)&local_310,(string *)local_238);
    if ((undefined **)local_238._0_8_ != ppuVar1) {
      operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
      operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
    }
  }
  cmSystemTools::ParseArguments(&local_2f0,&local_310);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_338,
             local_338.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             local_2f0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_2f0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_2d8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "fetch-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_278,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"fetch-err> ");
  bVar4 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,&local_338,(OutputParser *)local_2d8,
                     (OutputParser *)&local_278,Auto);
  if (!bVar4) {
    bVar4 = false;
    goto LAB_002485fc;
  }
  local_3b8 = &local_3a8;
  local_3b0 = 0;
  local_3a8 = 0;
  FindGitDir_abi_cxx11_((string *)local_238,this);
  plVar5 = (long *)std::__cxx11::string::append(local_238);
  local_398.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&local_398.super_LineParser.Prefix;
  plVar8 = plVar5 + 2;
  if ((char **)*plVar5 == (char **)plVar8) {
    local_398.super_LineParser.Prefix = (char *)*plVar8;
    local_398.super_LineParser.Line._M_dataplus._M_p = (pointer)plVar5[3];
  }
  else {
    local_398.super_LineParser.Prefix = (char *)*plVar8;
    local_398.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)*plVar5;
  }
  local_398.super_LineParser.Log = (ostream *)plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((undefined **)local_238._0_8_ != ppuVar1) {
    operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
  }
  std::ifstream::ifstream
            (local_238,(char *)local_398.super_LineParser.super_OutputParser._vptr_OutputParser,
             _S_in|_S_bin);
  if ((*(byte *)((long)&local_218 + (long)*(undefined **)(local_238._0_8_ + -0x18)) & 5) == 0) {
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    local_3d8._M_string_length = 0;
    local_3d8.field_2._M_local_buf[0] = '\0';
    bVar4 = true;
    if (local_3b0 == 0) {
      local_318 = this;
      do {
        bVar4 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)local_238,&local_3d8,(bool *)0x0,0xffffffffffffffff);
        if (!bVar4) {
          bVar4 = true;
          if (local_3b0 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                       "FETCH_HEAD has no upstream branch candidate!\n",0x2d);
            bVar4 = false;
          }
          goto LAB_002483d3;
        }
        poVar6 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"FETCH_HEAD> ",0xc);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_3d8._M_dataplus._M_p,local_3d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        lVar7 = std::__cxx11::string::find((char *)&local_3d8,0x87f713,0);
        if (lVar7 == -1) {
          lVar7 = std::__cxx11::string::find((char)&local_3d8,9);
          if (lVar7 != -1) {
            std::__cxx11::string::operator=((string *)&local_3b8,(string *)&local_3d8);
            this = local_318;
            std::__cxx11::string::resize((ulong)&local_3b8,(char)lVar7);
          }
        }
      } while (local_3b0 == 0);
      bVar4 = true;
    }
LAB_002483d3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p,
                      CONCAT71(local_3d8.field_2._M_allocated_capacity._1_7_,
                               local_3d8.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(local_238);
    if (local_398.super_LineParser.super_OutputParser._vptr_OutputParser !=
        (_func_int **)&local_398.super_LineParser.Prefix) {
      operator_delete(local_398.super_LineParser.super_OutputParser._vptr_OutputParser,
                      (ulong)(local_398.super_LineParser.Prefix + 1));
    }
    if (!bVar4) goto LAB_002485e3;
    local_238._0_8_ = local_238 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,local_358._M_dataplus._M_p,
               local_358._M_dataplus._M_p + local_358._M_string_length);
    local_218 = local_210._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"reset","");
    local_1f8[0] = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"--hard","");
    plVar5 = local_1c8;
    local_1d8[0] = plVar5;
    std::__cxx11::string::_M_construct<char*>((string *)local_1d8,local_3b8,local_3b8 + local_3b0);
    __l._M_len = 4;
    __l._M_array = (iterator)local_238;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_3d8,__l,(allocator_type *)&local_398);
    lVar7 = -0x80;
    do {
      if (plVar5 != (long *)plVar5[-2]) {
        operator_delete((long *)plVar5[-2],*plVar5 + 1);
      }
      plVar5 = plVar5 + -4;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0);
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)local_238,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
               "reset-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              (&local_398,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"reset-err> ");
    local_298._M_string_length = 0;
    local_298.field_2._M_local_buf[0] = '\0';
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    bVar4 = cmCTestVC::RunChild((cmCTestVC *)this,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_3d8,(OutputParser *)local_238,(OutputParser *)&local_398,
                                &local_298,Auto);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,
                      CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                               local_298.field_2._M_local_buf[0]) + 1);
    }
    local_398.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_00b1b468;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398.super_LineParser.Line._M_dataplus._M_p !=
        &local_398.super_LineParser.Line.field_2) {
      operator_delete(local_398.super_LineParser.Line._M_dataplus._M_p,
                      local_398.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    local_238._0_8_ = &PTR__LineParser_00b1b468;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._8_8_ != &local_210) {
      operator_delete((void *)local_228._8_8_,local_210._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_3d8);
  }
  else {
    poVar6 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Unable to open ",0xf);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_398.super_LineParser.super_OutputParser.
                                       _vptr_OutputParser,(long)local_398.super_LineParser.Log);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::ifstream::~ifstream(local_238);
    if (local_398.super_LineParser.super_OutputParser._vptr_OutputParser !=
        (_func_int **)&local_398.super_LineParser.Prefix) {
      operator_delete(local_398.super_LineParser.super_OutputParser._vptr_OutputParser,
                      (ulong)(local_398.super_LineParser.Prefix + 1));
    }
LAB_002485e3:
    bVar4 = false;
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,CONCAT71(uStack_3a7,local_3a8) + 1);
  }
LAB_002485fc:
  local_278.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00b1b468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.super_LineParser.Line._M_dataplus._M_p !=
      &local_278.super_LineParser.Line.field_2) {
    operator_delete(local_278.super_LineParser.Line._M_dataplus._M_p,
                    local_278.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_2d8._0_8_ = &PTR__LineParser_00b1b468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._24_8_ != &local_2b0) {
    operator_delete((void *)local_2d8._24_8_,local_2b0._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmCTestGIT::UpdateByFetchAndReset()
{
  std::string git = this->CommandLineTool;

  // Use "git fetch" to get remote commits.
  std::vector<std::string> git_fetch;
  git_fetch.push_back(git);
  git_fetch.emplace_back("fetch");

  // Add user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("GITUpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);
  cm::append(git_fetch, args);

  // Fetch upstream refs.
  OutputLogger fetch_out(this->Log, "fetch-out> ");
  OutputLogger fetch_err(this->Log, "fetch-err> ");
  if (!this->RunUpdateCommand(git_fetch, &fetch_out, &fetch_err)) {
    return false;
  }

  // Identify the merge head that would be used by "git pull".
  std::string sha1;
  {
    std::string fetch_head = this->FindGitDir() + "/FETCH_HEAD";
    cmsys::ifstream fin(fetch_head.c_str(), std::ios::in | std::ios::binary);
    if (!fin) {
      this->Log << "Unable to open " << fetch_head << "\n";
      return false;
    }
    std::string line;
    while (sha1.empty() && cmSystemTools::GetLineFromStream(fin, line)) {
      this->Log << "FETCH_HEAD> " << line << "\n";
      if (line.find("\tnot-for-merge\t") == std::string::npos) {
        std::string::size_type pos = line.find('\t');
        if (pos != std::string::npos) {
          sha1 = std::move(line);
          sha1.resize(pos);
        }
      }
    }
    if (sha1.empty()) {
      this->Log << "FETCH_HEAD has no upstream branch candidate!\n";
      return false;
    }
  }

  // Reset the local branch to point at that tracked from upstream.
  std::vector<std::string> git_reset = { git, "reset", "--hard", sha1 };
  OutputLogger reset_out(this->Log, "reset-out> ");
  OutputLogger reset_err(this->Log, "reset-err> ");
  return this->RunChild(git_reset, &reset_out, &reset_err);
}